

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O3

int lj_cf_table_sort(lua_State *L)

{
  int iVar1;
  TValue *pTVar2;
  MSize u;
  
  pTVar2 = L->base;
  if ((L->top <= pTVar2) || ((pTVar2->field_2).it != 0xfffffff4)) {
    lj_err_argt(L,1,5);
  }
  u = lj_tab_len((GCtab *)(ulong)(pTVar2->u32).lo);
  lua_settop(L,2);
  iVar1 = *(int *)((long)L->base + 0xc);
  if ((iVar1 != -1) && ((L->top <= L->base + 1 || (iVar1 != -9)))) {
    lj_err_argt(L,2,6);
  }
  auxsort(L,1,u);
  return 0;
}

Assistant:

LJLIB_CF(table_sort)
{
  GCtab *t = lj_lib_checktab(L, 1);
  int32_t n = (int32_t)lj_tab_len(t);
  lua_settop(L, 2);
  if (!tvisnil(L->base+1))
    lj_lib_checkfunc(L, 2);
  auxsort(L, 1, n);
  return 0;
}